

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

PLYElement * gvr::PLYElement::fromString(string *s)

{
  int iVar1;
  reference pvVar2;
  PLYElement *pPVar3;
  undefined8 uVar4;
  string *in_RDI;
  istringstream in;
  long n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  long in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  PLYElement *this;
  string *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  char *in_stack_fffffffffffffe18;
  istringstream local_1c0 [384];
  long local_40 [3];
  undefined1 local_28 [32];
  PLYElement *local_8;
  
  this = (PLYElement *)local_28;
  local_28._24_8_ = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x122ad1);
  gutil::split((vector *)this,(string *)local_28._24_8_,' ',true);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_28,0);
  iVar1 = std::__cxx11::string::compare((char *)pvVar2);
  if (iVar1 == 0) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_28,2);
    std::__cxx11::istringstream::istringstream(local_1c0,(string *)pvVar2,_S_in);
    std::istream::operator>>(local_1c0,local_40);
    pPVar3 = (PLYElement *)operator_new(0x40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_28,1);
    PLYElement(this,&pPVar3->name,in_stack_fffffffffffffdd0);
    local_8 = pPVar3;
    std::__cxx11::istringstream::~istringstream(local_1c0);
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_28,0);
    iVar1 = std::__cxx11::string::compare((char *)pvVar2);
    if (iVar1 != 0) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::operator+(in_stack_fffffffffffffe18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      gutil::IOException::IOException
                ((IOException *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08);
      __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
    pPVar3 = (PLYElement *)operator_new(0x40);
    std::__cxx11::string::substr((ulong)&stack0xfffffffffffffe18,local_28._24_8_);
    PLYElement(this,in_stack_fffffffffffffdd8,(long)pPVar3);
    local_8 = pPVar3;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return local_8;
}

Assistant:

PLYElement *PLYElement::fromString(const std::string &s)
{
  std::vector<std::string> list;

  gutil::split(list, s);

  if (list[0].compare("element") == 0)
  {
    long n;
    std::istringstream in(list[2]);
    in >> n;

    return new PLYElement(list[1], n);
  }
  else if (list[0].compare("comment") == 0)
  {
    return new PLYElement(s.substr(8), -1);
  }
  else
  {
    throw gutil::IOException("Invalid PLY element definition: "+s);
  }
}